

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void zng_flush_pending(zng_stream *strm)

{
  long lVar1;
  long in_RDI;
  deflate_state *s;
  uint32_t len;
  undefined4 local_1c;
  
  lVar1 = *(long *)(in_RDI + 0x38);
  zng_tr_flush_bits((deflate_state *)0x109011);
  if (*(uint *)(in_RDI + 0x20) < *(uint *)(lVar1 + 0x1c)) {
    local_1c = *(uint *)(in_RDI + 0x20);
  }
  else {
    local_1c = *(uint *)(lVar1 + 0x1c);
  }
  if (local_1c != 0) {
    memcpy(*(void **)(in_RDI + 0x18),*(void **)(lVar1 + 0x10),(ulong)local_1c);
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + (ulong)local_1c;
    *(ulong *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + (ulong)local_1c;
    *(ulong *)(in_RDI + 0x28) = (ulong)local_1c + *(long *)(in_RDI + 0x28);
    *(uint *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - local_1c;
    *(uint *)(lVar1 + 0x1c) = *(int *)(lVar1 + 0x1c) - local_1c;
    if (*(int *)(lVar1 + 0x1c) == 0) {
      *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar1 + 8);
    }
  }
  return;
}

Assistant:

Z_INTERNAL void PREFIX(flush_pending)(PREFIX3(stream) *strm) {
    uint32_t len;
    deflate_state *s = strm->state;

    zng_tr_flush_bits(s);
    len = MIN(s->pending, strm->avail_out);
    if (len == 0)
        return;

    Tracev((stderr, "[FLUSH]"));
    memcpy(strm->next_out, s->pending_out, len);
    strm->next_out  += len;
    s->pending_out  += len;
    strm->total_out += len;
    strm->avail_out -= len;
    s->pending      -= len;
    if (s->pending == 0)
        s->pending_out = s->pending_buf;
}